

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O1

int __thiscall
slang::parsing::Trivia::clone
          (Trivia *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  char *pcVar1;
  FullLocation *pFVar2;
  
  if (this->kind - 7 < 2) {
    pFVar2 = *(FullLocation **)&this->field_0;
  }
  else if ((this->kind == SkippedTokens) || (this->hasFullLocation == false)) {
    pFVar2 = *(FullLocation **)&this->field_0;
  }
  else {
    pFVar2 = BumpAllocator::emplace<slang::parsing::Trivia::FullLocation>((BumpAllocator *)__fn);
    pcVar1 = *(char **)&((this->field_0).syntaxNode)->kind;
    (pFVar2->text)._M_len = (size_t)((this->field_0).syntaxNode)->parent;
    (pFVar2->text)._M_str = pcVar1;
    pFVar2->location = ((this->field_0).fullLocation)->location;
  }
  return (int)pFVar2;
}

Assistant:

Trivia Trivia::clone(BumpAllocator& alloc) const {
    Trivia result;
    result.kind = kind;
    result.hasFullLocation = hasFullLocation;

    switch (kind) {
        case TriviaKind::Directive:
        case TriviaKind::SkippedSyntax:
            result.syntaxNode = syntaxNode;
            break;
        case TriviaKind::SkippedTokens:
            result.tokens = tokens;
            break;
        default:
            if (hasFullLocation) {
                result.fullLocation = alloc.emplace<FullLocation>();
                result.fullLocation->text = fullLocation->text;
                result.fullLocation->location = fullLocation->location;
            }
            else {
                result.rawText = rawText;
            }
            break;
    }

    return result;
}